

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void __thiscall QGridLayoutPrivate::recalcHFW(QGridLayoutPrivate *this,int w)

{
  int iVar1;
  QLayoutStruct *pQVar2;
  int iVar3;
  QList<QLayoutStruct> *this_00;
  int iVar4;
  long lVar5;
  
  if (this->hfwData == (QList<QLayoutStruct> *)0x0) {
    this_00 = (QList<QLayoutStruct> *)operator_new(0x18);
    QList<QLayoutStruct>::QList(this_00,(long)this->rr);
    this->hfwData = this_00;
  }
  setupHfwLayoutData(this);
  if ((long)this->rr < 1) {
    iVar4 = 0;
    iVar3 = 0;
  }
  else {
    pQVar2 = (this->hfwData->d).ptr;
    lVar5 = 0;
    iVar3 = 0;
    iVar4 = 0;
    do {
      iVar1 = *(int *)((long)&pQVar2->spacing + lVar5);
      iVar4 = iVar4 + iVar1 + *(int *)((long)&pQVar2->sizeHint + lVar5);
      iVar3 = iVar3 + iVar1 + *(int *)((long)&pQVar2->minimumSize + lVar5);
      lVar5 = lVar5 + 0x20;
    } while ((long)this->rr * 0x20 != lVar5);
  }
  this->hfw_width = w;
  if (0x7fffe < iVar4) {
    iVar4 = 0x7ffff;
  }
  this->hfw_height = iVar4;
  iVar4 = 0x7ffff;
  if (iVar3 < 0x7ffff) {
    iVar4 = iVar3;
  }
  this->hfw_minheight = iVar4;
  return;
}

Assistant:

void QGridLayoutPrivate::recalcHFW(int w)
{
    /*
      Go through all children, using colData and heightForWidth()
      and put the results in hfwData.
    */
    if (!hfwData)
        hfwData = new QList<QLayoutStruct>(rr);
    setupHfwLayoutData();
    QList<QLayoutStruct> &rData = *hfwData;

    int h = 0;
    int mh = 0;
    for (int r = 0; r < rr; r++) {
        int spacing = rData.at(r).spacing;
        h += rData.at(r).sizeHint + spacing;
        mh += rData.at(r).minimumSize + spacing;
    }

    hfw_width = w;
    hfw_height = qMin(QLAYOUTSIZE_MAX, h);
    hfw_minheight = qMin(QLAYOUTSIZE_MAX, mh);
}